

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O2

EdgeIter __thiscall CMU462::HalfedgeMesh::newEdge(HalfedgeMesh *this)

{
  iterator iVar1;
  Edge local_60;
  
  local_60.record.score = 0.0;
  local_60._halfedge._M_node = (_List_node_base *)0x0;
  local_60.index = 0;
  local_60.isNew = false;
  local_60._41_7_ = 0;
  local_60.super_HalfedgeElement._vptr_HalfedgeElement = (_func_int **)&PTR_centroid_00274e28;
  local_60.newPosition.z = 0.0;
  local_60.newPosition.x = 0.0;
  local_60.newPosition.y = 0.0;
  local_60.record.edge._M_node = (_List_node_base *)0x0;
  local_60.record.optimalPoint.x = 0.0;
  local_60.record.optimalPoint.y = 0.0;
  local_60.record.optimalPoint.z = 0.0;
  iVar1 = std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::emplace<CMU462::Edge>
                    (&this->edges,(const_iterator)&this->edges,&local_60);
  return (EdgeIter)iVar1._M_node;
}

Assistant:

EdgeIter newEdge() { return edges.insert(edges.end(), Edge()); }